

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_sse4.h
# Opt level: O0

__m128i blend_8_b10(uint16_t *src0,uint16_t *src1,__m128i v_m0_w,__m128i v_m1_w)

{
  void *in_RSI;
  void *pvVar1;
  void *in_RDI;
  __m128i alVar2;
  __m128i v_val_w;
  __m128i v_res_w;
  __m128i v_sum_w;
  __m128i v_p1_w;
  __m128i v_p0_w;
  __m128i v_s1_w;
  __m128i v_s0_w;
  
  pvVar1 = in_RSI;
  xx_loadu_128(in_RDI);
  alVar2 = xx_loadu_128(in_RSI);
  v_val_w[1] = (longlong)pvVar1;
  v_val_w[0] = 6;
  alVar2 = xx_roundn_epu16(v_val_w,(int)alVar2[1]);
  alVar2[0] = alVar2[0];
  alVar2[1] = alVar2[1];
  return alVar2;
}

Assistant:

static inline __m128i blend_8_b10(const uint16_t *src0, const uint16_t *src1,
                                  const __m128i v_m0_w, const __m128i v_m1_w) {
  const __m128i v_s0_w = xx_loadu_128(src0);
  const __m128i v_s1_w = xx_loadu_128(src1);

  const __m128i v_p0_w = _mm_mullo_epi16(v_s0_w, v_m0_w);
  const __m128i v_p1_w = _mm_mullo_epi16(v_s1_w, v_m1_w);

  const __m128i v_sum_w = _mm_add_epi16(v_p0_w, v_p1_w);

  const __m128i v_res_w = xx_roundn_epu16(v_sum_w, AOM_BLEND_A64_ROUND_BITS);

  return v_res_w;
}